

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tempdir.cpp
# Opt level: O2

string * fs_get_tempdir_abi_cxx11_(void)

{
  bool bVar1;
  string *in_RDI;
  string_view name;
  string_view fname;
  string_view in_stack_ffffffffffffff88;
  string t;
  path p;
  error_code ec;
  
  ec._M_value = 0;
  ec._M_cat = (error_category *)std::_V2::system_category();
  std::filesystem::temp_directory_path_abi_cxx11_((error_code *)&p);
  if ((ec._M_value == 0) && (p._M_pathname._M_string_length != 0)) {
    std::filesystem::__cxx11::path::generic_string(in_RDI,&p);
  }
  else {
    name._M_str = "TMPDIR";
    name._M_len = 6;
    fs_getenv_abi_cxx11_(&t,name);
    if (t._M_string_length == 0) {
      bVar1 = fs_is_dir("/tmp");
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)in_RDI,"/tmp",(allocator<char> *)&stack0xffffffffffffff97);
      }
      else {
        fname._M_str = "fs_get_tempdir";
        fname._M_len = 0xe;
        fs_print_error((string_view)(ZEXT816(0x1186dc) << 0x40),fname,&ec);
        (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
        in_RDI->_M_string_length = 0;
        (in_RDI->field_2)._M_local_buf[0] = '\0';
      }
    }
    else {
      fs_as_posix_abi_cxx11_(in_stack_ffffffffffffff88);
    }
    std::__cxx11::string::~string((string *)&t);
  }
  std::filesystem::__cxx11::path::~path(&p);
  return in_RDI;
}

Assistant:

std::string fs_get_tempdir()
{
  std::error_code ec;

#ifdef HAVE_CXX_FILESYSTEM
  auto p = std::filesystem::temp_directory_path(ec);
  if(!ec && !p.empty()) FFS_LIKELY
    return p.generic_string();
#endif

#if defined(_WIN32)
  // GetTempPath2A is not in MSYS2
  std::string t(fs_get_max_path(), '\0');
  auto L = GetTempPathA(static_cast<DWORD>(t.size()), t.data());
  if (L > 0)  FFS_LIKELY
    t.resize(L);
#else
  std::string t(fs_getenv("TMPDIR"));
#endif

  if(!t.empty()) FFS_LIKELY
    return fs_as_posix(t);

  if (fs_is_dir("/tmp"))
    return "/tmp";

  fs_print_error("", __func__, ec);
  return {};
}